

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O2

bool __thiscall arm::Operand2::operator==(Operand2 *this,Operand2 *other)

{
  bool bVar1;
  variant<arm::RegisterOperand,_int> other_;
  variant<arm::RegisterOperand,_int> this_;
  variant<arm::RegisterOperand,_int> vStack_48;
  variant<arm::RegisterOperand,_int> local_30;
  
  std::__detail::__variant::_Copy_ctor_base<false,_arm::RegisterOperand,_int>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)&local_30,
             (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
             &this->super_variant<arm::RegisterOperand,_int>);
  std::__detail::__variant::_Copy_ctor_base<false,_arm::RegisterOperand,_int>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)&vStack_48,
             (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
             &other->super_variant<arm::RegisterOperand,_int>);
  bVar1 = std::operator==(&local_30,&vStack_48);
  return bVar1;
}

Assistant:

bool operator==(const Operand2& other) const {
    auto this_ =
        dynamic_cast<const std::variant<RegisterOperand, int32_t>&>(*this);
    auto other_ =
        dynamic_cast<const std::variant<RegisterOperand, int32_t>&>(other);
    return this_ == other_;
  }